

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.cpp
# Opt level: O0

void __thiscall
Assimp::SpatialSort::FindPositions
          (SpatialSort *this,aiVector3D *pPosition,ai_real pRadius,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *poResults)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  pointer pEVar5;
  float fVar6;
  float fVar7;
  aiVector3t<float> aVar8;
  __normal_iterator<const_Assimp::SpatialSort::Entry_*,_std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>_>
  local_78;
  aiVector3t<float> local_70;
  aiVector3t<float> local_60;
  float local_54;
  const_iterator cStack_50;
  ai_real pSquared;
  __normal_iterator<const_Assimp::SpatialSort::Entry_*,_std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>_>
  local_48;
  const_iterator it;
  uint local_38;
  uint binaryStepSize;
  uint index;
  ai_real maxDist;
  ai_real minDist;
  ai_real dist;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *poResults_local;
  ai_real pRadius_local;
  aiVector3D *pPosition_local;
  SpatialSort *this_local;
  
  fVar6 = ::operator*(pPosition,&this->mPlaneNormal);
  fVar7 = fVar6 - pRadius;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(poResults);
  sVar3 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::size
                    (&this->mPositions);
  if (((sVar3 != 0) &&
      (pvVar4 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                ::front(&this->mPositions), pvVar4->mDistance <= fVar6 + pRadius)) &&
     (pvVar4 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
               ::back(&this->mPositions), fVar7 < pvVar4->mDistance || fVar7 == pvVar4->mDistance))
  {
    sVar3 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
            size(&this->mPositions);
    local_38 = (uint)(sVar3 >> 1) & 0x7fffffff;
    sVar3 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
            size(&this->mPositions);
    for (it._M_current._4_4_ = (uint)(sVar3 >> 2) & 0x3fffffff; 1 < it._M_current._4_4_;
        it._M_current._4_4_ = it._M_current._4_4_ >> 1) {
      pvVar4 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
               ::operator[](&this->mPositions,(ulong)local_38);
      uVar1 = it._M_current._4_4_;
      if (fVar7 <= pvVar4->mDistance) {
        uVar1 = -it._M_current._4_4_;
      }
      local_38 = uVar1 + local_38;
    }
    while( true ) {
      bVar2 = false;
      if (local_38 != 0) {
        pvVar4 = std::
                 vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
                 operator[](&this->mPositions,(ulong)local_38);
        bVar2 = fVar7 < pvVar4->mDistance;
      }
      if (!bVar2) break;
      local_38 = local_38 - 1;
    }
    while( true ) {
      sVar3 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
              size(&this->mPositions);
      bVar2 = false;
      if ((ulong)local_38 < sVar3 - 1) {
        pvVar4 = std::
                 vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
                 operator[](&this->mPositions,(ulong)local_38);
        bVar2 = pvVar4->mDistance < fVar7;
      }
      if (!bVar2) break;
      local_38 = local_38 + 1;
    }
    cStack_50 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                ::begin(&this->mPositions);
    local_48 = __gnu_cxx::
               __normal_iterator<const_Assimp::SpatialSort::Entry_*,_std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>_>
               ::operator+(&stack0xffffffffffffffb0,(ulong)local_38);
    local_54 = pRadius * pRadius;
    do {
      pEVar5 = __gnu_cxx::
               __normal_iterator<const_Assimp::SpatialSort::Entry_*,_std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>_>
               ::operator->(&local_48);
      if (fVar6 + pRadius <= pEVar5->mDistance) {
        return;
      }
      pEVar5 = __gnu_cxx::
               __normal_iterator<const_Assimp::SpatialSort::Entry_*,_std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>_>
               ::operator->(&local_48);
      aVar8 = ::operator-(&pEVar5->mPosition,pPosition);
      local_70._0_8_ = aVar8._0_8_;
      local_60.x = local_70.x;
      local_60.y = local_70.y;
      local_70.z = aVar8.z;
      local_60.z = local_70.z;
      local_70 = aVar8;
      fVar7 = aiVector3t<float>::SquareLength(&local_60);
      if (fVar7 < local_54) {
        pEVar5 = __gnu_cxx::
                 __normal_iterator<const_Assimp::SpatialSort::Entry_*,_std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>_>
                 ::operator->(&local_48);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (poResults,&pEVar5->mIndex);
      }
      __gnu_cxx::
      __normal_iterator<const_Assimp::SpatialSort::Entry_*,_std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>_>
      ::operator++(&local_48);
      local_78._M_current =
           (Entry *)std::
                    vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                    ::end(&this->mPositions);
      bVar2 = __gnu_cxx::operator==(&local_48,&local_78);
    } while (!bVar2);
  }
  return;
}

Assistant:

void SpatialSort::FindPositions( const aiVector3D& pPosition,
    ai_real pRadius, std::vector<unsigned int>& poResults) const
{
    const ai_real dist = pPosition * mPlaneNormal;
    const ai_real minDist = dist - pRadius, maxDist = dist + pRadius;

    // clear the array
    poResults.clear();

    // quick check for positions outside the range
    if( mPositions.size() == 0)
        return;
    if( maxDist < mPositions.front().mDistance)
        return;
    if( minDist > mPositions.back().mDistance)
        return;

    // do a binary search for the minimal distance to start the iteration there
    unsigned int index = (unsigned int)mPositions.size() / 2;
    unsigned int binaryStepSize = (unsigned int)mPositions.size() / 4;
    while( binaryStepSize > 1)
    {
        if( mPositions[index].mDistance < minDist)
            index += binaryStepSize;
        else
            index -= binaryStepSize;

        binaryStepSize /= 2;
    }

    // depending on the direction of the last step we need to single step a bit back or forth
    // to find the actual beginning element of the range
    while( index > 0 && mPositions[index].mDistance > minDist)
        index--;
    while( index < (mPositions.size() - 1) && mPositions[index].mDistance < minDist)
        index++;

    // Mow start iterating from there until the first position lays outside of the distance range.
    // Add all positions inside the distance range within the given radius to the result aray
    std::vector<Entry>::const_iterator it = mPositions.begin() + index;
    const ai_real pSquared = pRadius*pRadius;
    while( it->mDistance < maxDist)
    {
        if( (it->mPosition - pPosition).SquareLength() < pSquared)
            poResults.push_back( it->mIndex);
        ++it;
        if( it == mPositions.end())
            break;
    }

    // that's it
}